

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O2

void __thiscall MercuryJson::JSON::_error(JSON *this,char *expected,char encountered,size_t index)

{
  ostream *poVar1;
  char _encounter [3];
  size_t len;
  stringstream stream;
  char local_1db [3];
  size_t local_1d8;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1d8 = 0;
  __error_maybe_escape(local_1db,&local_1d8,encountered);
  local_1db[local_1d8] = '\0';
  poVar1 = std::operator<<(local_1a0,"expected ");
  poVar1 = std::operator<<(poVar1,expected);
  poVar1 = std::operator<<(poVar1," at index ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", but encountered \'");
  poVar1 = std::operator<<(poVar1,local_1db);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringbuf::str();
  __error(&local_1d0,this->input,index);
}

Assistant:

[[noreturn]] void JSON::_error(const char *expected, char encountered, size_t index) {
        std::stringstream stream;
        char _encounter[3];
        size_t len = 0;
        __error_maybe_escape(_encounter, &len, encountered);
        _encounter[len] = 0;
        stream << "expected " << expected << " at index " << index << ", but encountered '" << _encounter << "'";
        MercuryJson::__error(stream.str(), input, index);
    }